

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::WildCardJointObservation::operator()
          (WildCardJointObservation *this,iterator_t str,iterator_t end)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  pointer puVar2;
  iterator __position;
  
  pPVar1 = this->_m_po;
  puVar2 = (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  __position._M_current =
       (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = pPVar1->_m_anyJOIndex;
    (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
    return;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar1->_m_lp_JOI,__position,
             &pPVar1->_m_anyJOIndex);
  return;
}

Assistant:

void ParserDPOMDPFormat_Spirit::WildCardJointObservation::operator()(iterator_t str, iterator_t end) const
{
    if(DEBUG_PARSE )
        cout << "WildCardJointObservation: _m_lp_JOI.size()="<<_m_po->_m_lp_JOI.size();
    //this (can) contain elements from a failed indiv_action parse.
    _m_po->_m_lp_JO.clear();
    _m_po->_m_lp_JOI.clear();
    //this is different from how we handle joint actions: joint actions are 
    //immediately expanded (i.e. '*'/ANY_INDEX is replaced by all matching
    //indices.) 
    //For joint observations, this is not practical, as for most common reward
    //forms, this is not required. I.e., one will typically specify
    //R: ja : s : * : * : prob 
    //then we want to call addReward(ja,s) and not expand the succesor states
    //and joint observations...

    _m_po->_m_lp_JOI.push_back(_m_po->_m_anyJOIndex);
}